

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsGetExternalData(JsValueRef object,void **data)

{
  bool bVar1;
  JavascriptProxy *this;
  JsrtExternalObject *this_00;
  void *pvVar2;
  CustomExternalWrapperObject *this_01;
  JsErrorCode JVar3;
  DebugCheckNoException local_20;
  DebugCheckNoException __debugCheckNoException;
  
  if (object == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (data == (void **)0x0) {
    return JsErrorNullArgument;
  }
  local_20.hasException = true;
  local_20.__exceptionCheck = ExceptionCheck::Save();
  while (bVar1 = Js::VarIs<Js::JavascriptProxy>(object), bVar1) {
    this = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
    object = Js::JavascriptProxy::GetTarget(this);
  }
  bVar1 = Js::VarIs<JsrtExternalObject>(object);
  if (bVar1) {
    this_00 = Js::UnsafeVarTo<JsrtExternalObject>(object);
    pvVar2 = JsrtExternalObject::GetSlotData(this_00);
  }
  else {
    bVar1 = Js::VarIs<Js::CustomExternalWrapperObject>(object);
    if (!bVar1) {
      JVar3 = JsErrorInvalidArgument;
      pvVar2 = (void *)0x0;
      goto LAB_0037fd16;
    }
    this_01 = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object);
    pvVar2 = Js::CustomExternalWrapperObject::GetSlotData(this_01);
  }
  JVar3 = JsNoError;
LAB_0037fd16:
  *data = pvVar2;
  local_20.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_20);
  return JVar3;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetExternalData(_In_ JsValueRef object, _Out_ void **data)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(data);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            *data = Js::UnsafeVarTo<JsrtExternalObject>(object)->GetSlotData();
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            *data = Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->GetSlotData();
        }
#endif
        else
        {
            *data = nullptr;
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetExternalData(_In_ JsValueRef object, _In_opt_ void *data)
{
    VALIDATE_JSREF(object);

    BEGIN_JSRT_NO_EXCEPTION
    {
        while (Js::VarIs<Js::JavascriptProxy>(object))
        {
            object = Js::UnsafeVarTo<Js::JavascriptProxy>(object)->GetTarget();
        }
        if (Js::VarIs<JsrtExternalObject>(object))
        {
            Js::UnsafeVarTo<JsrtExternalObject>(object)->SetSlotData(data);
        }
#ifdef _CHAKRACOREBUILD
        else if (Js::VarIs<Js::CustomExternalWrapperObject>(object))
        {
            Js::UnsafeVarTo<Js::CustomExternalWrapperObject>(object)->SetSlotData(data);
        }
#endif
        else
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }
    }
    END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsCallFunction(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_opt_ JsValueRef *result)
{
    if(result != nullptr)
    {
        *result = nullptr;
    }